

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::AddLinkObject(cmComputeLinkDepends *this,cmLinkItem *item)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator __position;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  string *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar5;
  int index;
  _Rb_tree_color local_7c;
  long *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  long *local_58;
  undefined8 local_50;
  long local_48;
  undefined8 uStack_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  pVar5 = AllocateLinkEntry(this,item);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_7c = pVar5.first._M_node._M_node[3]._M_color;
    this_01 = (this->EntryList).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_start + (int)local_7c;
    psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    local_78 = (long *)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + psVar4->_M_string_length);
    local_38 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    p_Stack_30 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_30->_M_use_count = p_Stack_30->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_30->_M_use_count = p_Stack_30->_M_use_count + 1;
      }
    }
    if (local_78 == (long *)&local_68) {
      uStack_40 = uStack_60;
      local_58 = &local_48;
    }
    else {
      local_58 = local_78;
    }
    local_48 = CONCAT71(uStack_67,local_68);
    local_50 = local_70;
    local_70 = 0;
    local_68 = 0;
    local_78 = (long *)&local_68;
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_58);
    p_Var3 = p_Stack_30;
    peVar2 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(this_01->Item).Backtrace.
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8))->_M_pi;
    (this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8
    ))->_M_pi = p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if (local_78 != (long *)&local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
    this_01->Kind = Object;
    __position._M_current =
         (this->ObjectEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->ObjectEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                ((vector<int,std::allocator<int>> *)&this->ObjectEntries,__position,(int *)&local_7c
                );
    }
    else {
      *__position._M_current = local_7c;
      (this->ObjectEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkObject(cmLinkItem const& item)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    return;
  }

  // Initialize the item entry.
  int index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Kind = LinkEntry::Object;

  // Record explicitly linked object files separately.
  this->ObjectEntries.emplace_back(index);
}